

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *output_directory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  Params *this_00;
  bool bVar1;
  int iVar2;
  string *file_name;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *output_directory_local;
  string *package_dir_local;
  FileGenerator *this_local;
  
  this_00 = this->params_;
  file_name = FileDescriptor::name_abi_cxx11_(this->file_);
  bVar1 = Params::java_multiple_files(this_00,file_name);
  if (bVar1) {
    for (local_2c = 0; iVar2 = FileDescriptor::message_type_count(this->file_), local_2c < iVar2;
        local_2c = local_2c + 1) {
      descriptor = FileDescriptor::message_type(this->file_,local_2c);
      GenerateSibling<google::protobuf::compiler::javanano::MessageGenerator,google::protobuf::Descriptor>
                (package_dir,&this->java_package_,descriptor,output_directory,file_list,
                 this->params_);
    }
    bVar1 = Params::java_enum_style(this->params_);
    if (bVar1) {
      for (local_30 = 0; iVar2 = FileDescriptor::enum_type_count(this->file_), local_30 < iVar2;
          local_30 = local_30 + 1) {
        descriptor_00 = FileDescriptor::enum_type(this->file_,local_30);
        GenerateSibling<google::protobuf::compiler::javanano::EnumGenerator,google::protobuf::EnumDescriptor>
                  (package_dir,&this->java_package_,descriptor_00,output_directory,file_list,
                   this->params_);
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* output_directory,
                                     vector<string>* file_list) {
  if (params_.java_multiple_files(file_->name())) {
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        output_directory, file_list, params_);
    }

    if (params_.java_enum_style()) {
      for (int i = 0; i < file_->enum_type_count(); i++) {
        GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                       file_->enum_type(i),
                                       output_directory, file_list, params_);
      }
    }
  }
}